

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O1

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  int *piVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint _h;
  long lVar19;
  long lVar20;
  int iVar21;
  int kj;
  void *pvVar22;
  int iVar23;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  int k;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  int iVar30;
  long lVar31;
  float fVar32;
  vector<int,_std::allocator<int>_> _space_ofs;
  void *local_160;
  void *local_140;
  void *local_130;
  void *local_128;
  ulong local_120;
  ulong local_100;
  void *local_f8;
  allocator_type local_e1;
  ulong local_e0;
  ulong local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  Mat local_b8;
  void *local_68;
  long local_60;
  void *local_58;
  long local_50;
  vector<int,_std::allocator<int>_> local_48;
  
  iVar2 = bottom_blob->w;
  iVar3 = bottom_blob->h;
  uVar4 = bottom_blob->c;
  uVar13 = (ulong)uVar4;
  sVar5 = bottom_blob->elemsize;
  if (this->global_pooling == 0) {
    if (this->adaptive_pooling == 0) {
      local_b8.cstep = 0;
      local_b8.data = (void *)0x0;
      local_b8.refcount._0_4_ = 0;
      local_b8.refcount._4_4_ = 0;
      local_b8.elemsize._0_4_ = 0;
      local_b8.elemsize._4_4_ = 0;
      local_b8.elempack = 0;
      local_b8.allocator = (Allocator *)0x0;
      local_b8.dims = 0;
      local_b8.w = 0;
      local_b8.h = 0;
      local_b8.d = 0;
      local_b8.c = 0;
      make_padding(this,bottom_blob,&local_b8,opt);
      iVar3 = local_b8.h;
      iVar2 = local_b8.w;
      iVar23 = -100;
      if ((local_b8.data != (void *)0x0) && ((long)local_b8.c * local_b8.cstep != 0)) {
        iVar16 = (local_b8.w - this->kernel_w) / this->stride_w;
        uVar25 = (long)(local_b8.h - this->kernel_h) / (long)this->stride_h;
        local_d8 = uVar25 & 0xffffffff;
        uVar10 = iVar16 + 1;
        _h = (int)uVar25 + 1;
        uVar25 = (ulong)_h;
        Mat::create(top_blob,uVar10,_h,uVar4,sVar5,opt->blob_allocator);
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          uVar27 = (long)this->kernel_h * (long)this->kernel_w;
          std::vector<int,_std::allocator<int>_>::vector(&local_48,uVar27,&local_e1);
          if (0 < this->kernel_h) {
            iVar23 = this->kernel_w;
            iVar11 = 0;
            iVar15 = 0;
            iVar12 = 0;
            do {
              if (0 < this->kernel_w) {
                lVar18 = 0;
                do {
                  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar12 + lVar18] = iVar15 + (int)lVar18;
                  lVar18 = lVar18 + 1;
                  iVar24 = (int)lVar18;
                } while (iVar24 < this->kernel_w);
                iVar12 = iVar12 + iVar24;
                iVar15 = iVar15 + iVar24;
              }
              iVar15 = iVar15 + (iVar2 - iVar23);
              iVar11 = iVar11 + 1;
            } while (iVar11 < this->kernel_h);
          }
          iVar23 = (int)uVar27;
          if (this->pooling_type == 1) {
            if (this->avgpool_count_include_pad == 0) {
              iVar23 = 0;
              iVar11 = 0;
              if (this->pad_mode == 0) {
                iVar23 = (bottom_blob->w - local_b8.w) + this->pad_left + this->pad_right;
                iVar11 = (bottom_blob->h - local_b8.h) + this->pad_top + this->pad_bottom;
              }
              if (0 < (int)uVar4) {
                local_68 = local_b8.data;
                local_58 = top_blob->data;
                local_60 = top_blob->cstep * top_blob->elemsize;
                local_d0 = (long)this->stride_h;
                local_c0 = (long)(int)uVar10;
                local_50 = local_b8.cstep *
                           CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                lVar18 = (long)local_b8.w *
                         CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
                local_c8 = lVar18 * local_d0;
                local_e0 = 0;
                do {
                  if (-1 < (int)local_d8) {
                    local_140 = (void *)(local_60 * local_e0 + (long)local_58);
                    iVar15 = this->stride_w;
                    uVar4 = this->kernel_h;
                    local_130 = local_68;
                    local_100 = 0;
                    do {
                      if (-1 < iVar16) {
                        iVar12 = this->pad_top;
                        lVar31 = 0;
                        uVar27 = 0;
                        pvVar14 = local_130;
                        do {
                          fVar32 = NAN;
                          if (0 < (int)uVar4) {
                            lVar19 = (long)((iVar11 + iVar3) - this->pad_bottom);
                            fVar32 = 0.0;
                            uVar26 = 0;
                            iVar24 = 0;
                            pvVar22 = pvVar14;
                            do {
                              lVar20 = uVar26 + local_100 * local_d0;
                              iVar21 = 0x49;
                              if (iVar12 <= lVar20) {
                                iVar21 = 0;
                                if (lVar19 <= lVar20) {
                                  iVar21 = 0x47;
                                }
                                if (lVar20 < lVar19 && 0 < this->kernel_w) {
                                  uVar17 = 0;
                                  do {
                                    iVar30 = 0x4c;
                                    if (((long)this->pad_left <= (long)(lVar31 + uVar17)) &&
                                       (iVar30 = 0x4a,
                                       (long)(lVar31 + uVar17) <
                                       (long)((iVar23 + iVar2) - this->pad_right))) {
                                      fVar32 = fVar32 + *(float *)((long)pvVar22 + uVar17 * 4);
                                      iVar24 = iVar24 + 1;
                                      iVar30 = 0;
                                    }
                                    iVar21 = 0;
                                  } while (((iVar30 == 0x4c) || (iVar30 == 0)) &&
                                          (uVar17 = uVar17 + 1, (uint)this->kernel_w != uVar17));
                                }
                              }
                              if ((iVar21 != 0x49) && (iVar21 != 0)) break;
                              uVar26 = uVar26 + 1;
                              pvVar22 = (void *)((long)pvVar22 + lVar18);
                            } while (uVar26 != uVar4);
                            fVar32 = fVar32 / (float)iVar24;
                          }
                          *(float *)((long)local_140 + uVar27 * 4) = fVar32;
                          uVar27 = uVar27 + 1;
                          pvVar14 = (void *)((long)pvVar14 + (long)iVar15 * 4);
                          lVar31 = lVar31 + iVar15;
                        } while (uVar27 != uVar10);
                      }
                      local_140 = (void *)((long)local_140 + local_c0 * 4);
                      local_100 = local_100 + 1;
                      local_130 = (void *)((long)local_130 + local_c8);
                    } while (local_100 != uVar25);
                  }
                  local_e0 = local_e0 + 1;
                  local_68 = (void *)((long)local_68 + local_50);
                } while (local_e0 != uVar13);
              }
            }
            else if (0 < (int)uVar4) {
              sVar5 = top_blob->cstep;
              sVar6 = top_blob->elemsize;
              pvVar14 = top_blob->data;
              local_160 = (void *)0x0;
              do {
                if (-1 < (int)local_d8) {
                  pvVar22 = (void *)(sVar5 * sVar6 * (long)local_160 + (long)pvVar14);
                  iVar2 = this->stride_h;
                  iVar3 = this->stride_w;
                  uVar26 = 0;
                  do {
                    if (-1 < iVar16) {
                      uVar17 = 0;
                      do {
                        if (iVar23 < 1) {
                          fVar32 = 0.0;
                        }
                        else {
                          fVar32 = 0.0;
                          uVar28 = 0;
                          do {
                            fVar32 = fVar32 + *(float *)((long)local_b8.data +
                                                        (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar28] *
                                                  4 + uVar17 * (long)iVar3 * 4 +
                                                      uVar26 * (long)iVar2 *
                                                               (long)local_b8.w *
                                                               CONCAT44(local_b8.elemsize._4_4_,
                                                                        (undefined4)
                                                                        local_b8.elemsize) +
                                                      local_b8.cstep *
                                                      CONCAT44(local_b8.elemsize._4_4_,
                                                               (undefined4)local_b8.elemsize) *
                                                      (long)local_160);
                            uVar28 = uVar28 + 1;
                          } while ((uVar27 & 0xffffffff) != uVar28);
                        }
                        *(float *)((long)pvVar22 + uVar17 * 4) = fVar32 * (1.0 / (float)iVar23);
                        uVar17 = uVar17 + 1;
                      } while (uVar17 != uVar10);
                    }
                    pvVar22 = (void *)((long)pvVar22 + (long)(int)uVar10 * 4);
                    uVar26 = uVar26 + 1;
                  } while (uVar26 != uVar25);
                }
                local_160 = (void *)((long)local_160 + 1);
              } while (local_160 != (void *)uVar13);
            }
          }
          else if ((this->pooling_type == 0) && (0 < (int)uVar4)) {
            pvVar14 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            local_160 = (void *)0x0;
            do {
              if (-1 < (int)local_d8) {
                pvVar22 = (void *)(sVar5 * sVar6 * (long)local_160 + (long)pvVar14);
                iVar2 = this->stride_h;
                iVar3 = this->stride_w;
                uVar26 = 0;
                do {
                  if (-1 < iVar16) {
                    lVar18 = uVar26 * (long)iVar2 *
                                      (long)local_b8.w *
                                      CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize
                                              ) +
                             local_b8.cstep *
                             CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize) *
                             (long)local_160;
                    uVar17 = 0;
                    do {
                      lVar31 = uVar17 * (long)iVar3;
                      fVar32 = *(float *)((long)local_b8.data + lVar31 * 4 + lVar18);
                      if (0 < iVar23) {
                        uVar28 = 0;
                        do {
                          fVar1 = *(float *)((long)local_b8.data +
                                            (long)local_48.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar28] *
                                            4 + lVar31 * 4 + lVar18);
                          if (fVar32 <= fVar1) {
                            fVar32 = fVar1;
                          }
                          uVar28 = uVar28 + 1;
                        } while ((uVar27 & 0xffffffff) != uVar28);
                      }
                      *(float *)((long)pvVar22 + uVar17 * 4) = fVar32;
                      uVar17 = uVar17 + 1;
                    } while (uVar17 != uVar10);
                  }
                  pvVar22 = (void *)((long)pvVar22 + (long)(int)uVar10 * 4);
                  uVar26 = uVar26 + 1;
                } while (uVar26 != uVar25);
              }
              local_160 = (void *)((long)local_160 + 1);
            } while (local_160 != (void *)uVar13);
          }
          if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          iVar23 = 0;
        }
      }
      piVar9 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
            }
          }
          else {
            (*(local_b8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      Mat::create(top_blob,this->out_w,this->out_h,uVar4,sVar5,opt->blob_allocator);
      iVar23 = -100;
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        iVar23 = 0;
        if (this->pooling_type == 0) {
          if (0 < (int)uVar4) {
            pvVar14 = bottom_blob->data;
            lVar31 = bottom_blob->cstep * bottom_blob->elemsize;
            pvVar22 = top_blob->data;
            sVar5 = top_blob->cstep;
            sVar6 = top_blob->elemsize;
            uVar4 = this->out_w;
            iVar16 = this->out_h;
            lVar18 = (long)iVar2 * 4;
            local_130 = (void *)0x0;
            local_128 = pvVar14;
            do {
              if (0 < iVar16) {
                local_160 = (void *)(sVar5 * sVar6 * (long)local_130 + (long)pvVar22);
                iVar23 = 0;
                do {
                  iVar11 = iVar23 + 1;
                  iVar15 = (iVar11 * iVar3 + iVar16 + -1) / iVar16;
                  if (0 < (int)uVar4) {
                    iVar23 = (iVar23 * iVar3) / iVar16;
                    uVar25 = 0;
                    do {
                      iVar12 = ((int)uVar25 * iVar2) / (int)uVar4;
                      uVar27 = uVar25 + 1;
                      iVar24 = (int)((int)uVar27 * iVar2 + (uVar4 - 1)) / (int)uVar4;
                      fVar32 = *(float *)((long)pvVar14 +
                                         (long)(iVar12 + iVar23 * iVar2) * 4 +
                                         lVar31 * (long)local_130);
                      if (iVar23 < iVar15) {
                        lVar19 = (long)iVar23;
                        pvVar29 = (void *)(lVar18 * iVar23 + (long)local_128);
                        do {
                          lVar20 = (long)iVar12;
                          if (iVar12 < iVar24) {
                            do {
                              fVar1 = *(float *)((long)pvVar29 + lVar20 * 4);
                              if (fVar32 <= fVar1) {
                                fVar32 = fVar1;
                              }
                              lVar20 = lVar20 + 1;
                            } while (iVar24 != lVar20);
                          }
                          lVar19 = lVar19 + 1;
                          pvVar29 = (void *)((long)pvVar29 + lVar18);
                        } while (lVar19 != iVar15);
                      }
                      *(float *)((long)local_160 + uVar25 * 4) = fVar32;
                      uVar25 = uVar27;
                    } while (uVar27 != uVar4);
                  }
                  local_160 = (void *)((long)local_160 + (long)(int)uVar4 * 4);
                  iVar23 = iVar11;
                } while (iVar11 != iVar16);
              }
              local_130 = (void *)((long)local_130 + 1);
              local_128 = (void *)((long)local_128 + lVar31);
              iVar23 = 0;
            } while (local_130 != (void *)uVar13);
          }
        }
        else if ((this->pooling_type == 1) && (0 < (int)uVar4)) {
          local_f8 = bottom_blob->data;
          sVar5 = bottom_blob->cstep;
          pvVar14 = top_blob->data;
          sVar6 = top_blob->cstep;
          sVar7 = top_blob->elemsize;
          uVar4 = this->out_w;
          iVar16 = this->out_h;
          sVar8 = bottom_blob->elemsize;
          lVar18 = (long)iVar2 * 4;
          local_120 = 0;
          do {
            if (0 < iVar16) {
              local_160 = (void *)(sVar6 * sVar7 * local_120 + (long)pvVar14);
              iVar23 = 0;
              do {
                iVar11 = iVar23 + 1;
                iVar15 = (iVar11 * iVar3 + iVar16 + -1) / iVar16;
                if (0 < (int)uVar4) {
                  iVar23 = (iVar23 * iVar3) / iVar16;
                  uVar25 = 0;
                  do {
                    iVar24 = ((int)uVar25 * iVar2) / (int)uVar4;
                    uVar27 = uVar25 + 1;
                    iVar12 = (int)((int)uVar27 * iVar2 + (uVar4 - 1)) / (int)uVar4;
                    fVar32 = 0.0;
                    if (iVar23 < iVar15) {
                      pvVar22 = (void *)(lVar18 * iVar23 + (long)local_f8);
                      lVar31 = (long)iVar23;
                      do {
                        lVar19 = (long)iVar24;
                        if (iVar24 < iVar12) {
                          do {
                            fVar32 = fVar32 + *(float *)((long)pvVar22 + lVar19 * 4);
                            lVar19 = lVar19 + 1;
                          } while (iVar12 != lVar19);
                        }
                        lVar31 = lVar31 + 1;
                        pvVar22 = (void *)((long)pvVar22 + lVar18);
                      } while (lVar31 != iVar15);
                    }
                    *(float *)((long)local_160 + uVar25 * 4) =
                         fVar32 / ((float)(iVar12 - iVar24) * (float)(iVar15 - iVar23));
                    uVar25 = uVar27;
                  } while (uVar27 != uVar4);
                }
                local_160 = (void *)((long)local_160 + (long)(int)uVar4 * 4);
                iVar23 = iVar11;
              } while (iVar11 != iVar16);
            }
            local_120 = local_120 + 1;
            local_f8 = (void *)((long)local_f8 + sVar5 * sVar8);
            iVar23 = 0;
          } while (local_120 != uVar13);
        }
      }
    }
  }
  else {
    Mat::create(top_blob,uVar4,sVar5,opt->blob_allocator);
    iVar23 = -100;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      uVar10 = iVar3 * iVar2;
      if (this->pooling_type == 0) {
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar14 = bottom_blob->data;
        lVar18 = bottom_blob->cstep * bottom_blob->elemsize;
        pvVar22 = top_blob->data;
        uVar25 = 0;
        pvVar29 = pvVar14;
        do {
          fVar32 = *(float *)((long)pvVar14 + lVar18 * uVar25);
          if (0 < (int)uVar10) {
            uVar27 = 0;
            do {
              fVar1 = *(float *)((long)pvVar29 + uVar27 * 4);
              if (fVar32 <= fVar1) {
                fVar32 = fVar1;
              }
              uVar27 = uVar27 + 1;
            } while (uVar10 != uVar27);
          }
          *(float *)((long)pvVar22 + uVar25 * 4) = fVar32;
          uVar25 = uVar25 + 1;
          pvVar29 = (void *)((long)pvVar29 + lVar18);
        } while (uVar25 != uVar13);
      }
      else {
        if (this->pooling_type != 1) {
          return 0;
        }
        if ((int)uVar4 < 1) {
          return 0;
        }
        pvVar14 = bottom_blob->data;
        sVar5 = bottom_blob->cstep;
        pvVar22 = top_blob->data;
        sVar6 = bottom_blob->elemsize;
        uVar25 = 0;
        do {
          if ((int)uVar10 < 1) {
            fVar32 = 0.0;
          }
          else {
            fVar32 = 0.0;
            uVar27 = 0;
            do {
              fVar32 = fVar32 + *(float *)((long)pvVar14 + uVar27 * 4);
              uVar27 = uVar27 + 1;
            } while (uVar10 != uVar27);
          }
          *(float *)((long)pvVar22 + uVar25 * 4) = fVar32 * (1.0 / (float)(int)uVar10);
          uVar25 = uVar25 + 1;
          pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
        } while (uVar25 != uVar13);
      }
      iVar23 = 0;
    }
  }
  return iVar23;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + out_h - 1) / out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}